

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int maybe_new_socket(uv_tcp_t *handle,int domain,uint flags)

{
  int iVar1;
  int err;
  int sockfd;
  uint flags_local;
  int domain_local;
  uv_tcp_t *handle_local;
  
  if (domain != 0) {
    iVar1 = (handle->io_watcher).fd;
    if (iVar1 == -1) {
      iVar1 = new_socket(handle,domain,flags);
      return iVar1;
    }
    if ((((flags & 0x2000) != 0) && ((handle->flags & 0x2000) == 0)) &&
       (iVar1 = maybe_bind_socket(iVar1), iVar1 != 0)) {
      return iVar1;
    }
  }
  handle->flags = flags | handle->flags;
  return 0;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, unsigned int flags) {
  int sockfd;
  int err;

  if (domain == AF_UNSPEC)
    goto out;

  sockfd = uv__stream_fd(handle);
  if (sockfd == -1)
    return new_socket(handle, domain, flags);

  if (!(flags & UV_HANDLE_BOUND))
    goto out;

  if (handle->flags & UV_HANDLE_BOUND)
    goto out;  /* Already bound to a port. */

  err = maybe_bind_socket(sockfd);
  if (err)
    return err;

out:

  handle->flags |= flags;
  return 0;
}